

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O1

REF_STATUS ref_histogram_resolution(REF_HISTOGRAM ref_histogram,REF_INT nbin,REF_DBL exp)

{
  REF_INT *__s;
  REF_STATUS RVar1;
  
  ref_histogram->nbin = nbin;
  ref_histogram->exp = exp;
  if (ref_histogram->bins != (REF_INT *)0x0) {
    free(ref_histogram->bins);
  }
  if ((long)ref_histogram->nbin < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x42,"ref_histogram_resolution","malloc ref_histogram->bins of REF_INT negative");
    RVar1 = 1;
  }
  else {
    __s = (REF_INT *)malloc((long)ref_histogram->nbin << 2);
    ref_histogram->bins = __s;
    if (__s == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x42,"ref_histogram_resolution","malloc ref_histogram->bins of REF_INT NULL");
      RVar1 = 2;
    }
    else if ((long)ref_histogram->nbin < 1) {
      RVar1 = 0;
    }
    else {
      RVar1 = 0;
      memset(__s,0,(long)ref_histogram->nbin << 2);
    }
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_resolution(REF_HISTOGRAM ref_histogram,
                                            REF_INT nbin, REF_DBL exp) {
  ref_histogram_nbin(ref_histogram) = nbin;
  ref_histogram_exp(ref_histogram) = exp;

  ref_free(ref_histogram->bins);
  ref_malloc_init(ref_histogram->bins, ref_histogram_nbin(ref_histogram),
                  REF_INT, 0);

  return REF_SUCCESS;
}